

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::sr::anon_unknown_0::TextureGather2DCase::createInstance
          (TextureGather2DCase *this,Context *context)

{
  GatherType gatherType;
  OffsetSize OVar1;
  VkPhysicalDeviceProperties *pVVar2;
  TextureGatherInstance *this_00;
  Context *this_01;
  IVec2 *v;
  TextureFormat *format;
  GatherArgs *__cur;
  pointer pGVar3;
  TextureFormat local_50;
  vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  iterations;
  
  gatherType = (this->m_baseParams).gatherType;
  OVar1 = (this->m_baseParams).offsetSize;
  pVVar2 = Context::getDeviceProperties(context);
  if (OVar1 == OFFSETSIZE_NONE) {
    local_50.order = R;
    local_50.type = SNORM_INT8;
  }
  else if (OVar1 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
    local_50.order = (pVVar2->limits).minTexelGatherOffset;
    local_50.type = (pVVar2->limits).maxTexelGatherOffset;
  }
  else if (OVar1 == OFFSETSIZE_MINIMUM_REQUIRED) {
    local_50.order = ~RGB;
    local_50.type = UNORM_BYTE_44;
  }
  else {
    local_50.order = ~R;
    local_50.type = ~SNORM_INT8;
  }
  generateBasic2DCaseIterations
            (&iterations,gatherType,&(this->m_baseParams).textureFormat,(IVec2 *)&local_50);
  this_00 = (TextureGatherInstance *)operator_new(0x2d8);
  TextureGatherInstance::TextureGatherInstance(this_00,context,&this->m_baseParams);
  v = &this->m_textureSize;
  (this_00->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__TextureGather2DInstance_00bd3210;
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&this_00->field_0x264,v);
  *(undefined1 (*) [16])&this_00[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context =
       (undefined1  [16])0x0;
  this_00[1].super_ShaderRenderCaseInstance.m_sparseContext.
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
  .m_data.ptr = (SparseContext *)0x0;
  this_01 = (Context *)
            std::
            _Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
            ::_M_allocate((_Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                           *)(((long)iterations.
                                     super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)iterations.
                                    super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x24),(size_t)v);
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = this_01;
  *(Context **)&this_00[1].super_ShaderRenderCaseInstance.m_imageBackingMode = this_01;
  this_00[1].super_ShaderRenderCaseInstance.m_sparseContext.
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
  .m_data.ptr = (SparseContext *)
                (((long)iterations.
                        super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)iterations.
                       super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                       ._M_impl.super__Vector_impl_data._M_start) + (long)this_01);
  for (pGVar3 = iterations.
                super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pGVar3 != iterations.
                super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                ._M_impl.super__Vector_impl_data._M_finish; pGVar3 = pGVar3 + 1) {
    GatherArgs::GatherArgs((GatherArgs *)this_01,pGVar3);
    this_01 = (Context *)
              &(this_01->m_device).
               super_UniqueBase<vkt::DefaultDevice,_de::DefaultDeleter<vkt::DefaultDevice>_>.m_data.
               field_0xc;
  }
  *(Context **)&this_00[1].super_ShaderRenderCaseInstance.m_imageBackingMode = this_01;
  format = &local_50;
  local_50.order = CHANNELORDER_LAST;
  local_50.type = CHANNELTYPE_LAST;
  tcu::Texture2D::Texture2D
            ((Texture2D *)
             &this_00[1].super_ShaderRenderCaseInstance.m_sparseContext.
              super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
              .m_data.field_0x8,format,1,1);
  TextureGatherInstance::init(this_00,(EVP_PKEY_CTX *)format);
  std::
  _Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  ::~_Vector_base(&iterations.
                   super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                 );
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* TextureGather2DCase::createInstance (Context& context) const
{
	const vector<GatherArgs>	iterations	= generateBasic2DCaseIterations(m_baseParams.gatherType,
																			m_baseParams.textureFormat,
																			getOffsetRange(m_baseParams.offsetSize, context.getDeviceProperties().limits));

	return new TextureGather2DInstance(context, m_baseParams, m_textureSize, iterations);
}